

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_lib.c
# Opt level: O0

int engine_free_util(ENGINE *e,int not_locked)

{
  CRYPTO_REF_COUNT *pCVar1;
  int in_ESI;
  ENGINE *in_RDI;
  int i;
  int local_18;
  
  if (in_RDI != (ENGINE *)0x0) {
    if (in_ESI == 0) {
      LOCK();
      pCVar1 = &in_RDI->struct_ref;
      local_18 = *pCVar1;
      *pCVar1 = *pCVar1 + -1;
      UNLOCK();
      local_18 = local_18 + -1;
    }
    else {
      CRYPTO_DOWN_REF(&in_RDI->struct_ref,&local_18,global_engine_lock);
    }
    if (local_18 < 1) {
      engine_pkey_meths_free((ENGINE *)CONCAT44(not_locked,i));
      engine_pkey_asn1_meths_free((ENGINE *)CONCAT44(not_locked,i));
      if (in_RDI->destroy != (ENGINE_GEN_INT_FUNC_PTR)0x0) {
        (*in_RDI->destroy)(in_RDI);
      }
      engine_remove_dynamic_id(in_RDI,in_ESI);
      CRYPTO_free_ex_data(10,in_RDI,(CRYPTO_EX_DATA *)&in_RDI->ex_data);
      CRYPTO_free(in_RDI);
    }
  }
  return 1;
}

Assistant:

int engine_free_util(ENGINE *e, int not_locked)
{
    int i;

    if (e == NULL)
        return 1;
    if (not_locked)
        CRYPTO_DOWN_REF(&e->struct_ref, &i, global_engine_lock);
    else
        i = --e->struct_ref;
    ENGINE_REF_PRINT(e, 0, -1);
    if (i > 0)
        return 1;
    REF_ASSERT_ISNT(i < 0);
    /* Free up any dynamically allocated public key methods */
    engine_pkey_meths_free(e);
    engine_pkey_asn1_meths_free(e);
    /*
     * Give the ENGINE a chance to do any structural cleanup corresponding to
     * allocation it did in its constructor (eg. unload error strings)
     */
    if (e->destroy)
        e->destroy(e);
    engine_remove_dynamic_id(e, not_locked);
    CRYPTO_free_ex_data(CRYPTO_EX_INDEX_ENGINE, e, &e->ex_data);
    OPENSSL_free(e);
    return 1;
}